

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O2

Score * __thiscall xLearn::Solver::create_score(Solver *this)

{
  ObjectCreatorRegistry_xLearn_score_registry *this_00;
  Score *pSVar1;
  ostream *poVar2;
  allocator local_56;
  allocator local_55;
  Logger local_54;
  string local_50;
  string local_30;
  
  this_00 = GetRegistry_xLearn_score_registry();
  std::__cxx11::string::string
            ((string *)&local_50,(this->hyper_param_).score_func._M_dataplus._M_p,
             (allocator *)&local_30);
  pSVar1 = ObjectCreatorRegistry_xLearn_score_registry::CreateObject(this_00,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (pSVar1 == (Score *)0x0) {
    local_54.severity_ = FATAL;
    std::__cxx11::string::string
              ((string *)&local_50,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/solver/solver.cc"
               ,&local_55);
    std::__cxx11::string::string((string *)&local_30,"create_score",&local_56);
    poVar2 = Logger::Start(FATAL,&local_50,0x56,&local_30);
    poVar2 = std::operator<<(poVar2,"Cannot create score: ");
    std::operator<<(poVar2,(string *)&(this->hyper_param_).score_func);
    std::__cxx11::string::~string((string *)&local_30);
    std::__cxx11::string::~string((string *)&local_50);
    Logger::~Logger(&local_54);
  }
  return pSVar1;
}

Assistant:

Score* Solver::create_score() {
  Score* score;
  score = CREATE_SCORE(hyper_param_.score_func.c_str());
  if (score == nullptr) {
    LOG(FATAL) << "Cannot create score: "
               << hyper_param_.score_func;
  }
  return score;
}